

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::init_c_to_s(summarycalc *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  size_type __new_size;
  int local_14;
  int i;
  summarycalc *this_local;
  
  for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
    if (this->fout[local_14] != (FILE *)0x0) {
      pvVar1 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
      std::vector<int,_std::allocator<int>_>::vector(pvVar1);
      this->co_to_s_[local_14] = pvVar1;
      pvVar1 = this->co_to_s_[local_14];
      __new_size = std::vector<float,_std::allocator<float>_>::size(&this->coverages_);
      std::vector<int,_std::allocator<int>_>::resize(pvVar1,__new_size);
    }
  }
  return;
}

Assistant:

void summarycalc::init_c_to_s()
{
	for (int i = 0; i < MAX_SUMMARY_SETS; i++) {
		if (fout[i] != nullptr) {
			co_to_s_[i] = new coverage_id_or_output_id_to_Summary_id;
			co_to_s_[i]->resize(coverages_.size());
		}
	}
}